

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O1

pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
* __thiscall
AddrManImpl::SelectTriedCollision_
          (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
           *__return_storage_ptr__,AddrManImpl *this)

{
  unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
  *this_00;
  size_t sVar1;
  long lVar2;
  ServiceFlags SVar3;
  uint32_t uVar4;
  uint uVar5;
  int bucket;
  uint64_t uVar6;
  const_iterator __position;
  size_type sVar7;
  mapped_type *pmVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  nid_type id_new;
  key_type_conflict local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = (this->m_tried_collisions)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar1 == 0) {
    CService::CService((CService *)__return_storage_ptr__);
    (__return_storage_ptr__->first).nTime.__d.__r = 100000000;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00443a21;
    (__return_storage_ptr__->first).nServices = NODE_NONE;
    (__return_storage_ptr__->second).__d.__r = 0;
  }
  else {
    uVar9 = sVar1 - 1;
    if (uVar9 == 0) {
      uVar5 = 0x40;
    }
    else {
      lVar2 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar5 = (uint)lVar2 ^ 0x3f;
    }
    __position._M_node =
         (this->m_tried_collisions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      uVar6 = RandomMixin<FastRandomContext>::randbits
                        (&(this->insecure_rand).super_RandomMixin<FastRandomContext>,0x40 - uVar5);
    } while (uVar9 < uVar6);
    if ((long)uVar6 < 1) {
      for (; uVar6 != 0; uVar6 = uVar6 + 1) {
        __position._M_node = (_Base_ptr)std::_Rb_tree_decrement(__position._M_node);
      }
    }
    else {
      do {
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    local_40 = *(key_type_conflict *)(__position._M_node + 1);
    this_00 = &this->mapInfo;
    sVar7 = std::
            _Hashtable<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&this_00->_M_h,&local_40);
    if (sVar7 == 1) {
      pmVar8 = std::__detail::
               _Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_40);
      bucket = AddrInfo::GetTriedBucket(pmVar8,&this->nKey,this->m_netgroupman);
      uVar5 = AddrInfo::GetBucketPosition(pmVar8,&this->nKey,false,bucket);
      pmVar8 = std::__detail::
               _Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,
                            (key_type *)
                            ((long)this->vvTried[0] + (ulong)uVar5 * 8 + (ulong)(uint)(bucket << 9))
                           );
      prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)__return_storage_ptr__,
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)pmVar8);
      uVar4 = (pmVar8->super_CAddress).super_CService.super_CNetAddr.m_scope_id;
      (__return_storage_ptr__->first).super_CService.super_CNetAddr.m_net =
           (pmVar8->super_CAddress).super_CService.super_CNetAddr.m_net;
      (__return_storage_ptr__->first).super_CService.super_CNetAddr.m_scope_id = uVar4;
      (__return_storage_ptr__->first).super_CService.port =
           (pmVar8->super_CAddress).super_CService.port;
      SVar3 = (pmVar8->super_CAddress).nServices;
      (__return_storage_ptr__->first).nTime.__d.__r = (pmVar8->super_CAddress).nTime.__d.__r;
      (__return_storage_ptr__->first).nServices = SVar3;
      (__return_storage_ptr__->second).__d.__r = (pmVar8->m_last_try).__d.__r;
    }
    else {
      std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
      erase_abi_cxx11_((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                        *)&this->m_tried_collisions,__position);
      CService::CService((CService *)__return_storage_ptr__);
      (__return_storage_ptr__->first).nTime.__d.__r = 100000000;
      (__return_storage_ptr__->first).nServices = NODE_NONE;
      (__return_storage_ptr__->second).__d.__r = 0;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_00443a21:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<CAddress, NodeSeconds> AddrManImpl::SelectTriedCollision_()
{
    AssertLockHeld(cs);

    if (m_tried_collisions.size() == 0) return {};

    std::set<nid_type>::iterator it = m_tried_collisions.begin();

    // Selects a random element from m_tried_collisions
    std::advance(it, insecure_rand.randrange(m_tried_collisions.size()));
    nid_type id_new = *it;

    // If id_new not found in mapInfo remove it from m_tried_collisions
    if (mapInfo.count(id_new) != 1) {
        m_tried_collisions.erase(it);
        return {};
    }

    const AddrInfo& newInfo = mapInfo[id_new];

    // which tried bucket to move the entry to
    int tried_bucket = newInfo.GetTriedBucket(nKey, m_netgroupman);
    int tried_bucket_pos = newInfo.GetBucketPosition(nKey, false, tried_bucket);

    const AddrInfo& info_old = mapInfo[vvTried[tried_bucket][tried_bucket_pos]];
    return {info_old, info_old.m_last_try};
}